

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Close
          (CopyingFileOutputStream *this)

{
  int iVar1;
  LogMessage *other;
  int *piVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->is_closed_ == true) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0xcb);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  this->is_closed_ = true;
  iVar1 = anon_unknown_4::close_no_eintr(this->file_);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    this->errno_ = *piVar2;
  }
  return iVar1 == 0;
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Close() {
  GOOGLE_CHECK(!is_closed_);

  is_closed_ = true;
  if (close_no_eintr(file_) != 0) {
    // The docs on close() do not specify whether a file descriptor is still
    // open after close() fails with EIO.  However, the glibc source code
    // seems to indicate that it is not.
    errno_ = errno;
    return false;
  }

  return true;
}